

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imagecodec.hpp
# Opt level: O0

vec4 ImageCodec::decodeFLOAT_SFIXED5_NV<2>(ImageCodec *param_1,void *ptr)

{
  short sVar1;
  float *pfVar2;
  vec<4,_float,_(glm::precision)0> *in_RSI;
  int i;
  int16_t *data;
  vec4 result;
  int local_2c;
  vec<4,_float,_(glm::precision)0> *this;
  anon_union_16_4_ea85571f_for_vec<4,_float,_(glm::precision)0>_3 local_10;
  
  this = in_RSI;
  glm::vec<4,_float,_(glm::precision)0>::vec
            ((vec<4,_float,_(glm::precision)0> *)&local_10.field_0,0.0,0.0,0.0,1.0);
  for (local_2c = 0; local_2c < 2; local_2c = local_2c + 1) {
    sVar1 = *(short *)((long)&in_RSI->field_0 + (long)local_2c * 2);
    pfVar2 = glm::vec<4,_float,_(glm::precision)0>::operator[]
                       (this,(length_type)((ulong)in_RSI >> 0x20));
    *pfVar2 = (float)(int)sVar1 / 32.0;
  }
  return (anon_union_16_4_ea85571f_for_vec<4,_float,_(glm::precision)0>_3)
         (anon_union_16_4_ea85571f_for_vec<4,_float,_(glm::precision)0>_3)local_10.field_0;
}

Assistant:

static glm::vec4 decodeFLOAT_SFIXED5_NV(const ImageCodec*, const void* ptr) {
        static_assert((COMPONENTS > 0) && (COMPONENTS <= 4));
        auto data = reinterpret_cast<const int16_t*>(ptr);
        glm::vec4 result(0.f, 0.f, 0.f, 1.f);
        for (int i = 0; i < COMPONENTS; ++i)
            result[i] = data[i] / 32.f;
        return result;
    }